

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O3

uint rf_gfx_load_texture(void *data,int width,int height,rf_pixel_format format,int mipmap_count)

{
  rf_source_location source_location;
  rf_source_location source_location_00;
  int iVar1;
  uint uVar2;
  rf_pixel_format rVar3;
  uint uVar4;
  ulong uVar5;
  char *extraout_RDX;
  char *pcVar6;
  long lVar7;
  char *pcVar8;
  uint uVar9;
  int iVar11;
  rf_gfx_pixel_format rVar12;
  uint id;
  int swizzle_mask [4];
  uint local_158;
  uint local_154;
  uint local_150;
  uint local_14c;
  uint local_148;
  int local_144;
  void *local_140;
  undefined8 local_138;
  ulong local_130;
  int local_128 [6];
  long local_110;
  char *local_108;
  char *pcStack_100;
  undefined8 local_f8;
  char *local_f0;
  char *pcStack_e8;
  undefined8 local_e0;
  char *local_d8;
  char *pcStack_d0;
  undefined8 local_c8;
  char *local_c0;
  char *pcStack_b8;
  undefined8 local_b0;
  char *local_a8;
  char *pcStack_a0;
  undefined8 local_98;
  char *local_90;
  char *pcStack_88;
  undefined8 local_80;
  char *local_78;
  char *pcStack_70;
  undefined8 local_68;
  char *local_60;
  char *pcStack_58;
  undefined8 local_50;
  char *local_48;
  char *pcStack_40;
  undefined8 local_38;
  int iVar10;
  
  (*(rf__ctx->field_0).gfx_ctx.gl.BindTexture)(0xde1,0);
  local_158 = 0;
  uVar5 = (ulong)(format - RF_COMPRESSED_ETC1_RGB);
  pcVar6 = extraout_RDX;
  if ((format - RF_COMPRESSED_ETC1_RGB < 0xfffffffc) ||
     ((rf__ctx->field_0).gfx_ctx.extensions.tex_comp_dxt_supported != false)) {
    if ((format == RF_COMPRESSED_ETC1_RGB) &&
       ((rf__ctx->field_0).gfx_ctx.extensions.tex_comp_etc1_supported == false)) {
      local_60 = 
      "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      pcStack_58 = "rf_gfx_load_texture";
      local_50 = 0x9e02;
      pcVar8 = "ETC1 compressed texture format not supported";
    }
    else {
      rVar3 = format & ~RF_UNCOMPRESSED_GRAYSCALE;
      uVar5 = (ulong)rVar3;
      if ((rVar3 == RF_COMPRESSED_ETC2_RGB) &&
         ((rf__ctx->field_0).gfx_ctx.extensions.tex_comp_etc2_supported == false)) {
        local_78 = 
        "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
        ;
        pcStack_70 = "rf_gfx_load_texture";
        local_68 = 0x9e08;
        pcVar8 = "ETC2 compressed texture format not supported";
      }
      else if ((rVar3 == RF_COMPRESSED_PVRT_RGB) &&
              ((rf__ctx->field_0).gfx_ctx.extensions.tex_comp_pvrt_supported == false)) {
        local_90 = 
        "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
        ;
        pcStack_88 = "rf_gfx_load_texture";
        local_80 = 0x9e0e;
        pcVar8 = "PVRT compressed texture format not supported";
      }
      else if ((rVar3 == RF_COMPRESSED_ASTC_4x4_RGBA) &&
              ((rf__ctx->field_0).gfx_ctx.extensions.tex_comp_astc_supported == false)) {
        local_a8 = 
        "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
        ;
        pcStack_a0 = "rf_gfx_load_texture";
        local_98 = 0x9e14;
        pcVar8 = "ASTC compressed texture format not supported";
      }
      else {
        local_154 = height;
        local_150 = width;
        (*(rf__ctx->field_0).gfx_ctx.gl.PixelStorei)(0xcf5,1);
        (*(rf__ctx->field_0).gfx_ctx.gl.GenTextures)(1,&local_158);
        (*(rf__ctx->field_0).gfx_ctx.gl.BindTexture)(0xde1,local_158);
        local_c0 = 
        "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
        ;
        pcStack_b8 = "rf_gfx_load_texture";
        local_b0 = 0x9e24;
        local_140 = data;
        rf_log_impl(1,0x17c6b1,(char *)data);
        local_14c = mipmap_count;
        if (0 < mipmap_count) {
          local_110 = (long)mipmap_count;
          local_144 = rf_bits_per_pixel(format);
          local_148 = format - RF_UNCOMPRESSED_GRAYSCALE;
          lVar7 = 0;
          iVar11 = 0;
          uVar2 = local_150;
          uVar4 = local_154;
          local_130 = (ulong)format;
          do {
            iVar1 = uVar2 * uVar4 * local_144;
            iVar10 = iVar1 + 7;
            if (-1 < iVar1) {
              iVar10 = iVar1;
            }
            uVar9 = iVar10 >> 3;
            rVar12 = rf_gfx_get_internal_texture_formats((rf_pixel_format)local_130);
            local_138 = rVar12._0_8_;
            local_d8 = 
            "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
            ;
            pcStack_d0 = "rf_gfx_load_texture";
            local_c8 = 0x9e2d;
            source_location.proc_name._0_4_ = 0x17c5bd;
            source_location.file_name =
                 "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
            ;
            source_location.proc_name._4_4_ = 0;
            source_location.line_in_file = 0x9e2d;
            rf_log_impl(source_location,RF_LOG_TYPE_DEBUG,
                        "Load mipmap level %i (%i x %i), size: %i, offset: %i",lVar7,(ulong)uVar2,
                        (ulong)uVar4,(ulong)uVar9,iVar11);
            if ((rVar12._8_8_ >> 0x20 & 1) != 0) {
              if (local_148 < 10) {
                (*(rf__ctx->field_0).gfx_ctx.gl.TexImage2D)
                          (0xde1,(int)lVar7,(uint)local_138,uVar2,uVar4,0,
                           (uint)((ulong)local_138 >> 0x20),rVar12.type,
                           (void *)((long)iVar11 + (long)local_140));
              }
              else {
                (*(rf__ctx->field_0).gfx_ctx.gl.CompressedTexImage2D)
                          (0xde1,(int)lVar7,(uint)local_138,uVar2,uVar4,0,uVar9,
                           (void *)((long)iVar11 + (long)local_140));
              }
              if ((int)local_130 == 2) {
                local_128[3] = 0x1904;
              }
              else {
                if ((int)local_130 != 1) goto LAB_0011dd4d;
                local_128[3] = 1;
              }
              local_128[0] = 0x1903;
              local_128[1] = 0x1903;
              local_128[2] = 0x1903;
              (*(rf__ctx->field_0).gfx_ctx.gl.TexParameteriv)(0xde1,0x8e46,local_128);
            }
LAB_0011dd4d:
            uVar2 = (int)uVar2 / 2;
            uVar4 = (int)uVar4 / 2;
            iVar11 = iVar11 + uVar9;
            if ((int)uVar2 < 2) {
              uVar2 = 1;
            }
            if ((int)uVar4 < 2) {
              uVar4 = 1;
            }
            lVar7 = lVar7 + 1;
          } while (local_110 != lVar7);
        }
        (*(rf__ctx->field_0).gfx_ctx.gl.TexParameteri)(0xde1,0x2802,0x2901);
        (*(rf__ctx->field_0).gfx_ctx.gl.TexParameteri)(0xde1,0x2803,0x2901);
        (*(rf__ctx->field_0).gfx_ctx.gl.TexParameteri)(0xde1,0x2800,0x2600);
        (*(rf__ctx->field_0).gfx_ctx.gl.TexParameteri)(0xde1,0x2801,0x2600);
        uVar4 = local_14c;
        if (1 < (int)local_14c) {
          (*(rf__ctx->field_0).gfx_ctx.gl.TexParameteri)(0xde1,0x2800,0x2601);
          (*(rf__ctx->field_0).gfx_ctx.gl.TexParameteri)(0xde1,0x2801,0x2703);
        }
        (*(rf__ctx->field_0).gfx_ctx.gl.BindTexture)(0xde1,0);
        pcVar6 = (char *)(ulong)local_158;
        uVar5 = (ulong)local_150;
        if (local_158 != 0) {
          local_f0 = 
          "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
          ;
          pcStack_e8 = "rf_gfx_load_texture";
          local_e0 = 0x9e79;
          source_location_00.proc_name._0_4_ = 0x17c5bd;
          source_location_00.file_name =
               "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
          ;
          source_location_00.proc_name._4_4_ = 0;
          source_location_00.line_in_file = 0x9e79;
          rf_log_impl(source_location_00,RF_LOG_TYPE_INFO,
                      "[TEX ID %i] rf_texture created successfully (%ix%i - %i mipmaps)",pcVar6,
                      uVar5,(ulong)local_154,(ulong)uVar4);
          return local_158;
        }
        local_108 = 
        "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
        ;
        pcStack_100 = "rf_gfx_load_texture";
        local_f8 = 0x9e7a;
        pcVar8 = "rf_texture could not be created";
      }
    }
  }
  else {
    local_48 = 
    "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    pcStack_40 = "rf_gfx_load_texture";
    local_38 = 0x9dfc;
    pcVar8 = "DXT compressed texture format not supported";
  }
  rf_log_impl(4,(rf_log_type)pcVar8,pcVar6,uVar5);
  return local_158;
}

Assistant:

RF_API unsigned int rf_gfx_load_texture(void* data, int width, int height, rf_pixel_format format, int mipmap_count)
{
    rf_gl.BindTexture(GL_TEXTURE_2D, 0); // Free any old binding

    unsigned int id = 0;

    // Check texture format support by OpenGL 1.1 (compressed textures not supported)
    if ((!rf_gfx.extensions.tex_comp_dxt_supported) && ((format == RF_COMPRESSED_DXT1_RGB) || (format == RF_COMPRESSED_DXT1_RGBA) || (format == RF_COMPRESSED_DXT3_RGBA) || (format == RF_COMPRESSED_DXT5_RGBA)))
    {
        RF_LOG(RF_LOG_TYPE_WARNING, "DXT compressed texture format not supported");
        return id;
    }

    if ((!rf_gfx.extensions.tex_comp_etc1_supported) && (format == RF_COMPRESSED_ETC1_RGB))
    {
        RF_LOG(RF_LOG_TYPE_WARNING, "ETC1 compressed texture format not supported");
        return id;
    }

    if ((!rf_gfx.extensions.tex_comp_etc2_supported) && ((format == RF_COMPRESSED_ETC2_RGB) || (format == RF_COMPRESSED_ETC2_EAC_RGBA)))
    {
        RF_LOG(RF_LOG_TYPE_WARNING, "ETC2 compressed texture format not supported");
        return id;
    }

    if ((!rf_gfx.extensions.tex_comp_pvrt_supported) && ((format == RF_COMPRESSED_PVRT_RGB) || (format == RF_COMPRESSED_PVRT_RGBA)))
    {
        RF_LOG(RF_LOG_TYPE_WARNING, "PVRT compressed texture format not supported");
        return id;
    }

    if ((!rf_gfx.extensions.tex_comp_astc_supported) && ((format == RF_COMPRESSED_ASTC_4x4_RGBA) || (format == RF_COMPRESSED_ASTC_8x8_RGBA)))
    {
        RF_LOG(RF_LOG_TYPE_WARNING, "ASTC compressed texture format not supported");
        return id;
    }

    rf_gl.PixelStorei(GL_UNPACK_ALIGNMENT, 1);

    rf_gl.GenTextures(1, &id);              // Generate texture id

    //rf_gl.ActiveTexture(GL_TEXTURE0);     // If not defined, using GL_TEXTURE0 by default (shader texture)

    rf_gl.BindTexture(GL_TEXTURE_2D, id);

    int mip_width = width;
    int mip_height = height;
    int mip_offset = 0;          // Mipmap data offset

    RF_LOG(RF_LOG_TYPE_DEBUG, "Load texture from data memory address: 0x%x", data);

    // Load the different mipmap levels
    for (rf_int i = 0; i < mipmap_count; i++)
    {
        int mip_size = rf_pixel_buffer_size(mip_width, mip_height, format);

        rf_gfx_pixel_format glformat = rf_gfx_get_internal_texture_formats(format);

        RF_LOG(RF_LOG_TYPE_DEBUG, "Load mipmap level %i (%i x %i), size: %i, offset: %i", i, mip_width, mip_height, mip_size, mip_offset);

        if (glformat.valid)
        {
            if (rf_is_uncompressed_format(format))
            {
                rf_gl.TexImage2D(GL_TEXTURE_2D, i, glformat.internal_format, mip_width, mip_height, 0, glformat.format, glformat.type, (unsigned char* )data + mip_offset);
            }
            else
            {
                rf_gl.CompressedTexImage2D(GL_TEXTURE_2D, i, glformat.internal_format, mip_width, mip_height, 0, mip_size, (unsigned char *)data + mip_offset);
            }

            #if defined(RAYFORK_GRAPHICS_BACKEND_GL_33)
                if (format == RF_UNCOMPRESSED_GRAYSCALE)
                {
                    int swizzle_mask[] = { GL_RED, GL_RED, GL_RED, GL_ONE };
                    rf_gl.TexParameteriv(GL_TEXTURE_2D, GL_TEXTURE_SWIZZLE_RGBA, swizzle_mask);
                }
                else if (format == RF_UNCOMPRESSED_GRAY_ALPHA)
                {
                    int swizzle_mask[] = { GL_RED, GL_RED, GL_RED, GL_GREEN };
                    rf_gl.TexParameteriv(GL_TEXTURE_2D, GL_TEXTURE_SWIZZLE_RGBA, swizzle_mask);
                }
            #endif
        }

        mip_width /= 2;
        mip_height /= 2;
        mip_offset += mip_size;

        // Security check for NPOT textures
        if (mip_width < 1) mip_width = 1;
        if (mip_height < 1) mip_height = 1;
    }

    // rf_texture parameters configuration
    // NOTE: rf_gl.TexParameteri does NOT affect texture uploading, just the way it's used
    #if defined(RAYFORK_GRAPHICS_BACKEND_GL_ES3)
        // NOTE: OpenGL ES 2.0 with no GL_OES_texture_npot support (i.e. WebGL) has limited NPOT support, so CLAMP_TO_EDGE must be used
        if (rf_gfx.extensions.tex_npot_supported)
        {
            rf_gl.TexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, GL_REPEAT);       // Set texture to repeat on x-axis
            rf_gl.TexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, GL_REPEAT);       // Set texture to repeat on y-axis
        }
        else
        {
            // NOTE: If using negative texture coordinates (LoadOBJ()), it does not work!
            rf_gl.TexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE);       // Set texture to clamp on x-axis
            rf_gl.TexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, GL_CLAMP_TO_EDGE);       // Set texture to clamp on y-axis
        }
    #else
        rf_gl.TexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, GL_REPEAT);       // Set texture to repeat on x-axis
        rf_gl.TexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, GL_REPEAT);       // Set texture to repeat on y-axis
    #endif

    // Magnification and minification filters
    rf_gl.TexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);  // Alternative: GL_LINEAR
    rf_gl.TexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);  // Alternative: GL_LINEAR

    #if defined(RAYFORK_GRAPHICS_BACKEND_GL_33)
    if (mipmap_count > 1)
    {
        // Activate Trilinear filtering if mipmaps are available
        rf_gl.TexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_LINEAR);
        rf_gl.TexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR_MIPMAP_LINEAR);
    }
    #endif

    // At this point we have the texture loaded in GPU and texture parameters configured

    // NOTE: If mipmaps were not in data, they are not generated automatically

    // Unbind current texture
    rf_gl.BindTexture(GL_TEXTURE_2D, 0);

    if (id > 0) RF_LOG(RF_LOG_TYPE_INFO, "[TEX ID %i] rf_texture created successfully (%ix%i - %i mipmaps)", id, width, height, mipmap_count);
    else RF_LOG(RF_LOG_TYPE_WARNING, "rf_texture could not be created");

    return id;
}